

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::mouseMoveEvent(QGraphicsItem *this,QGraphicsSceneMouseEvent *event)

{
  TransformData *pTVar1;
  bool bVar2;
  Int IVar3;
  Int IVar4;
  QGraphicsItemPrivate *pQVar5;
  QGraphicsItem **ppQVar6;
  QPointF *pQVar7;
  QWidget *pQVar8;
  qsizetype qVar9;
  const_reference ppQVar10;
  QEvent *in_RSI;
  TransformData *in_RDI;
  long in_FS_OFFSET;
  bool bVar11;
  qreal qVar12;
  qreal in_XMM1_Qa;
  bool movedMe;
  int i;
  QGraphicsView *view;
  add_const_t<QList<QGraphicsItem_*>_> *__range4;
  QPointF buttonDownParentPos;
  QPointF currentParentPos;
  QGraphicsItem *item_1;
  QGraphicsItem *item;
  const_iterator __end4;
  const_iterator __begin4;
  QHash<QGraphicsItem_*,_QPointF> initialPositions;
  QList<QGraphicsItem_*> selectedItems;
  QTransform viewToParentTransform;
  QTransform itemTransform;
  QTransform viewToItemTransform;
  undefined4 in_stack_fffffffffffff9e8;
  GraphicsItemFlag in_stack_fffffffffffff9ec;
  TransformData *in_stack_fffffffffffff9f0;
  TransformData *in_stack_fffffffffffff9f8;
  TransformData *in_stack_fffffffffffffa00;
  TransformData *in_stack_fffffffffffffa08;
  TransformData *in_stack_fffffffffffffa10;
  QGraphicsItem *in_stack_fffffffffffffa18;
  QGraphicsScene *in_stack_fffffffffffffa20;
  TransformData *in_stack_fffffffffffffa38;
  QGraphicsItem *in_stack_fffffffffffffa40;
  byte local_5a9;
  int local_58c;
  QGraphicsItem *local_588;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_564;
  QPointF local_560;
  QPointF local_550;
  QPointF local_540;
  QPointF local_530;
  QPointF local_520;
  QPointF local_510;
  QPointF local_500;
  QPointF local_4f0;
  QPointF local_4e0;
  QPoint local_4d0;
  QPoint local_4c8;
  qreal local_4b0;
  qreal local_4a8;
  QPoint local_4a0;
  QPoint local_498;
  qreal local_480;
  qreal local_478;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_470;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_46c;
  QPoint local_468;
  QPoint local_460;
  undefined8 local_448;
  qreal local_440;
  QPointF local_438;
  QPoint local_428;
  QPoint local_420;
  undefined8 local_408;
  qreal local_400;
  QPointF local_3f8;
  QPointF local_3e8;
  QPointF local_3d8;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_3c8;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_3c4;
  TransformData *local_3c0;
  QPointF local_3b0;
  QPointF local_3a0;
  QGraphicsItem *local_390;
  QGraphicsItem **local_388;
  const_iterator local_380;
  const_iterator local_378 [4];
  QHash<QGraphicsItem_*,_QPointF> local_358;
  QList<QGraphicsItem_*> local_350;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_338;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_334;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_330;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_32c;
  undefined1 local_2d8 [80];
  QTransform local_288;
  bool local_238 [80];
  QTransform local_1e8;
  undefined1 local_198 [80];
  undefined1 local_148 [240];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_330.super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorage<Qt::MouseButton>)
       QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)in_stack_fffffffffffff9f0);
  local_32c.super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorage<Qt::MouseButton>)
       QFlags<Qt::MouseButton>::operator&
                 ((QFlags<Qt::MouseButton> *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_32c);
  bVar11 = false;
  if (IVar3 != 0) {
    local_338.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
         (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
         flags((QGraphicsItem *)in_stack_fffffffffffff9f0);
    local_334.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
         (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
         QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                   ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_stack_fffffffffffff9f0,
                    in_stack_fffffffffffff9ec);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_334);
    bVar11 = IVar4 != 0;
  }
  if (bVar11) {
    local_350.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_350.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_350.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0x985a47);
    local_358.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QHash<QGraphicsItem_*,_QPointF>::QHash(&local_358);
    pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)((in_RDI->transform).m_matrix[0] + 1));
    if (pQVar5->scene != (QGraphicsScene *)0x0) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)((in_RDI->transform).m_matrix[0] + 1));
      QGraphicsScene::selectedItems(in_stack_fffffffffffffa20);
      QList<QGraphicsItem_*>::operator=
                ((QList<QGraphicsItem_*> *)in_stack_fffffffffffff9f0,
                 (QList<QGraphicsItem_*> *)
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x985ac9);
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)((in_RDI->transform).m_matrix[0] + 1));
      QGraphicsScene::d_func((QGraphicsScene *)0x985ae6);
      QHash<QGraphicsItem_*,_QPointF>::operator=
                ((QHash<QGraphicsItem_*,_QPointF> *)in_stack_fffffffffffffa00,
                 (QHash<QGraphicsItem_*,_QPointF> *)in_stack_fffffffffffff9f8);
      bVar11 = QHash<QGraphicsItem_*,_QPointF>::isEmpty(&local_358);
      if (bVar11) {
        local_378[0].i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
        local_378[0] = QList<QGraphicsItem_*>::begin
                                 ((QList<QGraphicsItem_*> *)in_stack_fffffffffffff9f0);
        local_380.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
        local_380 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_stack_fffffffffffff9f0)
        ;
        while( true ) {
          local_388 = local_380.i;
          bVar11 = QList<QGraphicsItem_*>::const_iterator::operator!=(local_378,local_380);
          if (!bVar11) break;
          ppQVar6 = QList<QGraphicsItem_*>::const_iterator::operator*(local_378);
          local_390 = *ppQVar6;
          local_3a0 = pos((QGraphicsItem *)in_stack_fffffffffffff9f8);
          pQVar7 = QHash<QGraphicsItem_*,_QPointF>::operator[]
                             ((QHash<QGraphicsItem_*,_QPointF> *)in_stack_fffffffffffffa00,
                              (QGraphicsItem **)in_stack_fffffffffffff9f8);
          pQVar7->xp = local_3a0.xp;
          pQVar7->yp = local_3a0.yp;
          QList<QGraphicsItem_*>::const_iterator::operator++(local_378);
        }
        local_3b0 = pos((QGraphicsItem *)in_stack_fffffffffffff9f8);
        in_XMM1_Qa = local_3b0.yp;
        pQVar7 = QHash<QGraphicsItem_*,_QPointF>::operator[]
                           ((QHash<QGraphicsItem_*,_QPointF> *)in_stack_fffffffffffffa00,
                            (QGraphicsItem **)in_stack_fffffffffffff9f8);
        pQVar7->xp = local_3b0.xp;
        pQVar7->yp = local_3b0.yp;
      }
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)((in_RDI->transform).m_matrix[0] + 1));
      QGraphicsScene::d_func((QGraphicsScene *)0x985c95);
      QHash<QGraphicsItem_*,_QPointF>::operator=
                ((QHash<QGraphicsItem_*,_QPointF> *)in_stack_fffffffffffffa00,
                 (QHash<QGraphicsItem_*,_QPointF> *)in_stack_fffffffffffff9f8);
    }
    local_588 = (QGraphicsItem *)0x0;
    pQVar8 = QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x985cc5);
    if (pQVar8 != (QWidget *)0x0) {
      QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x985cd8);
      QWidget::parentWidget((QWidget *)0x985ce0);
      local_588 = (QGraphicsItem *)qobject_cast<QGraphicsView*>((QObject *)0x985ce8);
    }
    bVar11 = false;
    for (local_58c = 0; qVar9 = QList<QGraphicsItem_*>::size(&local_350), local_58c <= qVar9;
        local_58c = local_58c + 1) {
      local_3c0 = (TransformData *)0x0;
      qVar9 = QList<QGraphicsItem_*>::size(&local_350);
      pTVar1 = in_RDI;
      if (local_58c < qVar9) {
        ppQVar10 = QList<QGraphicsItem_*>::at
                             ((QList<QGraphicsItem_*> *)in_stack_fffffffffffff9f0,
                              CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        pTVar1 = (TransformData *)*ppQVar10;
      }
      local_3c0 = pTVar1;
      if (local_3c0 == in_RDI) {
        if (bVar11) break;
        bVar11 = true;
      }
      local_3c8.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
           (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
           flags((QGraphicsItem *)in_stack_fffffffffffff9f0);
      local_3c4.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
           (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
           QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                     ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_stack_fffffffffffff9f0,
                      in_stack_fffffffffffff9ec);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3c4);
      local_5a9 = 0;
      if (IVar4 != 0) {
        bVar2 = QGraphicsItemPrivate::movableAncestorIsSelected
                          ((QGraphicsItem *)in_stack_fffffffffffff9f0);
        local_5a9 = bVar2 ^ 0xff;
      }
      if ((local_5a9 & 1) != 0) {
        local_3d8.xp = -NAN;
        local_3d8.yp = -NAN;
        QPointF::QPointF(&local_3d8);
        local_3e8.xp = -NAN;
        local_3e8.yp = -NAN;
        QPointF::QPointF(&local_3e8);
        if ((local_588 == (QGraphicsItem *)0x0) ||
           (pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                   *)((local_3c0->transform).m_matrix[0] + 1)),
           (*(ulong *)&pQVar5->field_0x160 & 0x40000) == 0)) {
          bVar2 = false;
          if (local_588 != (QGraphicsItem *)0x0) {
            local_470.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
                 (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
                 flags((QGraphicsItem *)in_stack_fffffffffffff9f0);
            local_46c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
                 (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
                 QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                           ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_stack_fffffffffffff9f0,
                            in_stack_fffffffffffff9ec);
            IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_46c);
            bVar2 = IVar4 != 0;
          }
          if (bVar2) {
            memcpy(local_148,&DAT_00b42210,0x50);
            QTransform::QTransform(&in_stack_fffffffffffff9f0->transform);
            pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                   *)((local_3c0->transform).m_matrix[0] + 1));
            if (pQVar5->transformData != (TransformData *)0x0) {
              QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
              operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                          *)((local_3c0->transform).m_matrix[0] + 1));
              QGraphicsItemPrivate::TransformData::computedFullTransform
                        (in_stack_fffffffffffffa10,&in_stack_fffffffffffffa08->transform);
              memcpy(local_148,local_198,0x4a);
            }
            pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                   *)((local_3c0->transform).m_matrix[0] + 1));
            in_stack_fffffffffffffa18 = (QGraphicsItem *)QPointF::x(&pQVar5->pos);
            pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                   *)((local_3c0->transform).m_matrix[0] + 1));
            qVar12 = QPointF::y(&pQVar5->pos);
            QTransform::translate((double)in_stack_fffffffffffffa18,qVar12);
            memcpy(&local_1e8,&DAT_00b42260,0x50);
            sceneTransform((QGraphicsItem *)in_stack_fffffffffffffa00);
            QGraphicsView::viewportTransform((QGraphicsView *)in_stack_fffffffffffffa08);
            QTransform::operator*(&local_288,(QTransform *)local_2d8);
            QTransform::inverted(local_238);
            QTransform::operator*(&local_1e8,(QTransform *)local_148);
            local_4a0 = QGraphicsSceneMouseEvent::screenPos
                                  ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffff9f0);
            local_498 = QWidget::mapFromGlobal
                                  ((QWidget *)in_stack_fffffffffffffa00,
                                   (QPoint *)in_stack_fffffffffffff9f8);
            QPointF::QPointF((QPointF *)in_stack_fffffffffffff9f0,
                             (QPoint *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8)
                            );
            local_480 = (qreal)QTransform::map((QPointF *)&local_1e8);
            local_478 = qVar12;
            local_3d8.xp = local_480;
            local_3d8.yp = qVar12;
            local_4d0 = QGraphicsSceneMouseEvent::buttonDownScreenPos
                                  ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffa00,
                                   (MouseButton)((ulong)in_stack_fffffffffffffa18 >> 0x20));
            local_4c8 = QWidget::mapFromGlobal
                                  ((QWidget *)in_stack_fffffffffffffa00,
                                   (QPoint *)in_stack_fffffffffffff9f8);
            QPointF::QPointF((QPointF *)in_stack_fffffffffffff9f0,
                             (QPoint *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8)
                            );
            local_4b0 = (qreal)QTransform::map((QPointF *)&local_1e8);
            local_4a8 = qVar12;
            local_3e8.xp = local_4b0;
            local_3e8.yp = qVar12;
          }
          else {
            in_stack_fffffffffffff9f8 = local_3c0;
            in_stack_fffffffffffffa00 = local_3c0;
            local_500 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)local_3c0);
            local_4f0 = mapFromScene(in_stack_fffffffffffffa18,(QPointF *)in_stack_fffffffffffffa10)
            ;
            local_4e0 = mapToParent((QGraphicsItem *)in_stack_fffffffffffffa08,
                                    (QPointF *)in_stack_fffffffffffffa00);
            local_3d8.xp = local_4e0.xp;
            local_3d8.yp = local_4e0.yp;
            in_stack_fffffffffffffa08 = local_3c0;
            in_stack_fffffffffffffa10 = local_3c0;
            local_530 = QGraphicsSceneMouseEvent::buttonDownScenePos
                                  ((QGraphicsSceneMouseEvent *)local_3c0,
                                   (MouseButton)((ulong)in_stack_fffffffffffffa38 >> 0x20));
            local_520 = mapFromScene(in_stack_fffffffffffffa18,(QPointF *)in_stack_fffffffffffffa10)
            ;
            local_510 = mapToParent((QGraphicsItem *)in_stack_fffffffffffffa08,
                                    (QPointF *)in_stack_fffffffffffffa00);
            local_3e8.xp = local_510.xp;
            local_3e8.yp = local_510.yp;
          }
        }
        else {
          memcpy(local_58,&DAT_00b421c0,0x50);
          in_stack_fffffffffffffa38 = local_3c0;
          QGraphicsView::viewportTransform((QGraphicsView *)in_stack_fffffffffffffa08);
          deviceTransform(in_stack_fffffffffffffa40,&in_stack_fffffffffffffa38->transform);
          QTransform::inverted((bool *)local_58);
          in_stack_fffffffffffffa40 = local_588;
          local_428 = QGraphicsSceneMouseEvent::screenPos
                                ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffff9f0);
          local_420 = QWidget::mapFromGlobal
                                ((QWidget *)in_stack_fffffffffffffa00,
                                 (QPoint *)in_stack_fffffffffffff9f8);
          QPointF::QPointF((QPointF *)in_stack_fffffffffffff9f0,
                           (QPoint *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
          local_408 = QTransform::map((QPointF *)local_58);
          local_400 = in_XMM1_Qa;
          local_3f8 = mapToParent((QGraphicsItem *)in_stack_fffffffffffffa08,
                                  (QPointF *)in_stack_fffffffffffffa00);
          qVar12 = local_3f8.yp;
          local_3d8.xp = local_3f8.xp;
          local_3d8.yp = qVar12;
          local_468 = QGraphicsSceneMouseEvent::buttonDownScreenPos
                                ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffa00,
                                 (MouseButton)((ulong)in_stack_fffffffffffffa18 >> 0x20));
          local_460 = QWidget::mapFromGlobal
                                ((QWidget *)in_stack_fffffffffffffa00,
                                 (QPoint *)in_stack_fffffffffffff9f8);
          QPointF::QPointF((QPointF *)in_stack_fffffffffffff9f0,
                           (QPoint *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
          local_448 = QTransform::map((QPointF *)local_58);
          local_440 = qVar12;
          local_438 = mapToParent((QGraphicsItem *)in_stack_fffffffffffffa08,
                                  (QPointF *)in_stack_fffffffffffffa00);
          local_3e8.xp = local_438.xp;
          local_3e8.yp = local_438.yp;
        }
        in_stack_fffffffffffff9f0 = local_3c0;
        local_560 = QHash<QGraphicsItem_*,_QPointF>::value
                              ((QHash<QGraphicsItem_*,_QPointF> *)in_stack_fffffffffffffa08,
                               (QGraphicsItem **)in_stack_fffffffffffffa00);
        local_550 = ::operator+((QPointF *)in_stack_fffffffffffff9f8,
                                (QPointF *)in_stack_fffffffffffff9f0);
        local_540 = ::operator-((QPointF *)in_stack_fffffffffffff9f8,
                                (QPointF *)in_stack_fffffffffffff9f0);
        in_XMM1_Qa = local_540.yp;
        setPos((QGraphicsItem *)in_stack_fffffffffffffa00,(QPointF *)in_stack_fffffffffffff9f8);
        flags((QGraphicsItem *)in_stack_fffffffffffff9f0);
        local_564.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
             (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
             QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                       ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_stack_fffffffffffff9f0,
                        in_stack_fffffffffffff9ec);
        IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_564);
        if (IVar4 != 0) {
          setSelected((QGraphicsItem *)in_stack_fffffffffffffa10,
                      SUB81((ulong)in_stack_fffffffffffffa08 >> 0x38,0));
        }
      }
    }
    QHash<QGraphicsItem_*,_QPointF>::~QHash
              ((QHash<QGraphicsItem_*,_QPointF> *)in_stack_fffffffffffff9f0);
    QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x986616);
  }
  else {
    QEvent::ignore(in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::mouseMoveEvent(QGraphicsSceneMouseEvent *event)
{
    if ((event->buttons() & Qt::LeftButton) && (flags() & ItemIsMovable)) {
        // Determine the list of items that need to be moved.
        QList<QGraphicsItem *> selectedItems;
        QHash<QGraphicsItem *, QPointF> initialPositions;
        if (d_ptr->scene) {
            selectedItems = d_ptr->scene->selectedItems();
            initialPositions = d_ptr->scene->d_func()->movingItemsInitialPositions;
            if (initialPositions.isEmpty()) {
                for (QGraphicsItem *item : std::as_const(selectedItems))
                    initialPositions[item] = item->pos();
                initialPositions[this] = pos();
            }
            d_ptr->scene->d_func()->movingItemsInitialPositions = initialPositions;
        }

        // Find the active view.
        QGraphicsView *view = nullptr;
        if (event->widget())
            view = qobject_cast<QGraphicsView *>(event->widget()->parentWidget());

        // Move all selected items
        int i = 0;
        bool movedMe = false;
        while (i <= selectedItems.size()) {
            QGraphicsItem *item = nullptr;
            if (i < selectedItems.size())
                item = selectedItems.at(i);
            else
                item = this;
            if (item == this) {
                // Slightly clumsy-looking way to ensure that "this" is part
                // of the list of items to move, this is to avoid allocations
                // (appending this item to the list of selected items causes a
                // detach).
                if (movedMe)
                    break;
                movedMe = true;
            }

            if ((item->flags() & ItemIsMovable) && !QGraphicsItemPrivate::movableAncestorIsSelected(item)) {
                QPointF currentParentPos;
                QPointF buttonDownParentPos;
                if (view && (item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorIgnoresTransformations)) {
                    // Items whose ancestors ignore transformations need to
                    // map screen coordinates to local coordinates, then map
                    // those to the parent.
                    QTransform viewToItemTransform = (item->deviceTransform(view->viewportTransform())).inverted();
                    currentParentPos = mapToParent(viewToItemTransform.map(QPointF(view->mapFromGlobal(event->screenPos()))));
                    buttonDownParentPos = mapToParent(viewToItemTransform.map(QPointF(view->mapFromGlobal(event->buttonDownScreenPos(Qt::LeftButton)))));
                } else if (view && (item->flags() & ItemIgnoresTransformations)) {
                    // Root items that ignore transformations need to
                    // calculate their diff by mapping viewport coordinates
                    // directly to parent coordinates.
                    // COMBINE
                    QTransform itemTransform;
                    if (item->d_ptr->transformData)
                        itemTransform = item->d_ptr->transformData->computedFullTransform();
                    itemTransform.translate(item->d_ptr->pos.x(), item->d_ptr->pos.y());
                    QTransform viewToParentTransform = itemTransform
                                                       * (item->sceneTransform() * view->viewportTransform()).inverted();
                    currentParentPos = viewToParentTransform.map(QPointF(view->mapFromGlobal(event->screenPos())));
                    buttonDownParentPos = viewToParentTransform.map(QPointF(view->mapFromGlobal(event->buttonDownScreenPos(Qt::LeftButton))));
                } else {
                    // All other items simply map from the scene.
                    currentParentPos = item->mapToParent(item->mapFromScene(event->scenePos()));
                    buttonDownParentPos = item->mapToParent(item->mapFromScene(event->buttonDownScenePos(Qt::LeftButton)));
                }

                item->setPos(initialPositions.value(item) + currentParentPos - buttonDownParentPos);

                if (item->flags() & ItemIsSelectable)
                    item->setSelected(true);
            }
            ++i;
        }

    } else {
        event->ignore();
    }
}